

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiDeviceInitializationTests.cpp
# Opt level: O2

TestCaseGroup * vkt::api::createDeviceInitializationTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> deviceInitializationTests;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"device_init","Device Initialization Tests");
  deviceInitializationTests.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr = pTVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"create_instance_name_version",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_1::createInstanceTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = deviceInitializationTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"create_instance_invalid_api_version",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_1::createInstanceWithInvalidApiVersionTest
                 );
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = deviceInitializationTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"create_instance_null_appinfo",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,
                  anon_unknown_1::createInstanceWithNullApplicationInfoTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = deviceInitializationTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"create_instance_unsupported_extensions",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,
                  anon_unknown_1::createInstanceWithUnsupportedExtensionsTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = deviceInitializationTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"create_device",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_1::createDeviceTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = deviceInitializationTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"create_multiple_devices",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_1::createMultipleDevicesTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = deviceInitializationTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"create_device_unsupported_extensions",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,
                  anon_unknown_1::createDeviceWithUnsupportedExtensionsTest);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = deviceInitializationTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"create_device_various_queue_counts",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_1::createDeviceWithVariousQueueCountsTest)
  ;
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = deviceInitializationTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"create_device_features2",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_1::createDeviceFeatures2Test);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = deviceInitializationTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  deviceInitializationTests.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&deviceInitializationTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createDeviceInitializationTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	deviceInitializationTests (new tcu::TestCaseGroup(testCtx, "device_init", "Device Initialization Tests"));

	addFunctionCase(deviceInitializationTests.get(), "create_instance_name_version",			"", createInstanceTest);
	addFunctionCase(deviceInitializationTests.get(), "create_instance_invalid_api_version",		"", createInstanceWithInvalidApiVersionTest);
	addFunctionCase(deviceInitializationTests.get(), "create_instance_null_appinfo",		    "", createInstanceWithNullApplicationInfoTest);
	addFunctionCase(deviceInitializationTests.get(), "create_instance_unsupported_extensions",	"", createInstanceWithUnsupportedExtensionsTest);
	addFunctionCase(deviceInitializationTests.get(), "create_device",							"", createDeviceTest);
	addFunctionCase(deviceInitializationTests.get(), "create_multiple_devices",					"", createMultipleDevicesTest);
	addFunctionCase(deviceInitializationTests.get(), "create_device_unsupported_extensions",	"", createDeviceWithUnsupportedExtensionsTest);
	addFunctionCase(deviceInitializationTests.get(), "create_device_various_queue_counts",		"", createDeviceWithVariousQueueCountsTest);
	addFunctionCase(deviceInitializationTests.get(), "create_device_features2",					"", createDeviceFeatures2Test);

	return deviceInitializationTests.release();
}